

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  ulong uVar1;
  byte bVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  cJSON *pcVar7;
  int iVar8;
  cJSON_bool cVar9;
  lconv *plVar10;
  long lVar11;
  cJSON *item_00;
  cJSON *pcVar12;
  byte bVar13;
  uint uVar14;
  cJSON *item_01;
  long in_FS_OFFSET;
  bool bVar15;
  double dVar16;
  uchar *after_end;
  byte *local_80;
  byte local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar9 = 0;
  if ((input_buffer == (parse_buffer *)0x0) ||
     (puVar3 = input_buffer->content, puVar3 == (uchar *)0x0)) goto LAB_00103aba;
  uVar4 = input_buffer->length;
  uVar5 = input_buffer->offset;
  uVar1 = uVar5 + 4;
  if ((uVar4 < uVar1) || (iVar8 = strncmp((char *)(puVar3 + uVar5),"null",4), iVar8 != 0)) {
    if ((uVar5 + 5 <= uVar4) && (iVar8 = strncmp((char *)(puVar3 + uVar5),"false",5), iVar8 == 0)) {
      item->type = 1;
      input_buffer->offset = uVar5 + 5;
      goto LAB_00103898;
    }
    if ((uVar1 <= uVar4) && (iVar8 = strncmp((char *)(puVar3 + uVar5),"true",4), iVar8 == 0)) {
      item->type = 2;
      item->valueint = 1;
      goto LAB_00103894;
    }
    if (uVar4 <= uVar5) goto LAB_00103ab8;
    if (puVar3[uVar5] == '\"') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        cVar9 = parse_string(item,input_buffer);
        return cVar9;
      }
      goto LAB_00103ad9;
    }
    if (uVar5 < uVar4) {
      if (puVar3[uVar5] == '-' || (byte)(puVar3[uVar5] - 0x30) < 10) {
        local_80 = (byte *)0x0;
        plVar10 = localeconv();
        puVar3 = input_buffer->content;
        if (puVar3 != (uchar *)0x0) {
          bVar2 = *plVar10->decimal_point;
          uVar1 = input_buffer->length;
          sVar6 = input_buffer->offset;
          lVar11 = 0;
          do {
            if ((uVar1 <= sVar6 + lVar11) ||
               ((bVar13 = puVar3[lVar11 + sVar6], 9 < bVar13 - 0x30 &&
                ((uVar14 = bVar13 - 0x2b, 0x3a < uVar14 ||
                 (((0x400000004000005U >> ((ulong)uVar14 & 0x3f) & 1) == 0 &&
                  (bVar13 = bVar2, (ulong)uVar14 != 3)))))))) goto LAB_0010393b;
            local_78[lVar11] = bVar13;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x3f);
          lVar11 = 0x3f;
LAB_0010393b:
          local_78[lVar11] = 0;
          dVar16 = strtod((char *)local_78,(char **)&local_80);
          if (local_78 != local_80) {
            item->valuedouble = dVar16;
            iVar8 = 0x7fffffff;
            if ((dVar16 < 2147483647.0) && (iVar8 = -0x80000000, -2147483648.0 < dVar16)) {
              iVar8 = (int)dVar16;
            }
            item->valueint = iVar8;
            item->type = 8;
            input_buffer->offset = (size_t)(local_80 + (input_buffer->offset - (long)local_78));
            goto LAB_00103898;
          }
        }
        goto LAB_00103ab8;
      }
      if (uVar4 <= uVar5) goto LAB_00103ab8;
      if (puVar3[uVar5] == '[') {
        cVar9 = 0;
        if (input_buffer->depth < 1000) {
          input_buffer->depth = input_buffer->depth + 1;
          if (puVar3[uVar5] == '[') {
            input_buffer->offset = uVar5 + 1;
            buffer_skip_whitespace(input_buffer);
            uVar1 = input_buffer->offset;
            if (input_buffer->length <= uVar1) {
LAB_00103aa1:
              input_buffer->offset = uVar1 - 1;
              goto LAB_00103aa8;
            }
            if (input_buffer->content[uVar1] == ']') {
              item_01 = (cJSON *)0x0;
              item_00 = (cJSON *)0x0;
LAB_00103910:
              input_buffer->depth = input_buffer->depth - 1;
              if (item_01 != (cJSON *)0x0) {
                item_01->prev = item_00;
              }
              item->type = 0x20;
              item->child = item_01;
              input_buffer->offset = input_buffer->offset + 1;
              goto LAB_00103898;
            }
            if (input_buffer->length <= uVar1) goto LAB_00103aa1;
            input_buffer->offset = uVar1 - 1;
            item_01 = (cJSON *)0x0;
            pcVar12 = (cJSON *)0x0;
            do {
              item_00 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
              if (item_00 == (cJSON *)0x0) {
                bVar15 = false;
                item_00 = pcVar12;
              }
              else {
                item_00->valuedouble = 0.0;
                item_00->string = (char *)0x0;
                item_00->valuestring = (char *)0x0;
                *(undefined8 *)&item_00->valueint = 0;
                item_00->child = (cJSON *)0x0;
                *(undefined8 *)&item_00->type = 0;
                item_00->next = (cJSON *)0x0;
                item_00->prev = (cJSON *)0x0;
                pcVar7 = item_00;
                if (item_01 != (cJSON *)0x0) {
                  pcVar12->next = item_00;
                  item_00->prev = pcVar12;
                  pcVar7 = item_01;
                }
                item_01 = pcVar7;
                input_buffer->offset = input_buffer->offset + 1;
                buffer_skip_whitespace(input_buffer);
                cVar9 = parse_value(item_00,input_buffer);
                bVar15 = cVar9 != 0;
                if (bVar15) {
                  buffer_skip_whitespace(input_buffer);
                }
              }
              if (!bVar15) goto LAB_00103aab;
              uVar1 = input_buffer->offset;
              if (input_buffer->length <= uVar1) goto LAB_00103aab;
              pcVar12 = item_00;
            } while (input_buffer->content[uVar1] == ',');
            if ((uVar1 < input_buffer->length) && (input_buffer->content[uVar1] == ']'))
            goto LAB_00103910;
          }
          else {
LAB_00103aa8:
            item_01 = (cJSON *)0x0;
          }
LAB_00103aab:
          if (item_01 != (cJSON *)0x0) {
            cJSON_Delete(item_01);
          }
          goto LAB_00103ab8;
        }
      }
      else {
        if (uVar4 <= uVar5) goto LAB_00103ab8;
        cVar9 = 0;
        if (puVar3[uVar5] == '{') {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            cVar9 = parse_object(item,input_buffer);
            return cVar9;
          }
          goto LAB_00103ad9;
        }
      }
    }
    else {
LAB_00103ab8:
      cVar9 = 0;
    }
  }
  else {
    item->type = 4;
LAB_00103894:
    input_buffer->offset = uVar1;
LAB_00103898:
    cVar9 = 1;
  }
LAB_00103aba:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cVar9;
  }
LAB_00103ad9:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }

    return false;
}